

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O0

void __thiscall
rigtorp::SPSCQueue<int,_Allocator<int>_>::~SPSCQueue(SPSCQueue<int,_Allocator<int>_> *this)

{
  int *piVar1;
  SPSCQueue<int,_Allocator<int>_> *this_local;
  
  while( true ) {
    piVar1 = front(this);
    if (piVar1 == (int *)0x0) break;
    pop(this);
  }
  std::allocator_traits<Allocator<int>_>::deallocate
            ((Allocator<int> *)this,this->slots_,this->capacity_ + 0x20);
  return;
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }